

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O2

MatrixXd * __thiscall
Tools::CalculateJacobian(MatrixXd *__return_storage_ptr__,Tools *this,VectorXd *x_state)

{
  double dVar1;
  double dVar2;
  CoeffReturnType pdVar3;
  ostream *poVar4;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar5;
  float fVar6;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  float fVar7;
  float fVar8;
  Scalar local_d0;
  float local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_b0;
  double local_90;
  double local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  Scalar local_38;
  Scalar local_30;
  float local_28;
  uint uStack_24;
  uint uStack_20;
  uint uStack_1c;
  
  local_b0.m_xpr._0_4_ = 3;
  local_d0 = (Scalar)CONCAT44(local_d0._4_4_,4);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(int *)&local_b0,
             (int *)&local_d0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,0);
  fVar6 = (float)*pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,1);
  local_c8 = (float)*pdVar3;
  uStack_c4 = extraout_XMM0_Db;
  uStack_c0 = extraout_XMM0_Dc;
  uStack_bc = extraout_XMM0_Dd;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,2);
  dVar1 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,3);
  fVar8 = fVar6 * fVar6 + local_c8 * local_c8;
  if (0.0001 <= ABS(fVar8)) {
    dVar2 = *pdVar3;
    fVar7 = SQRT(fVar8);
    local_d0 = (Scalar)(fVar6 / fVar7);
    local_88 = local_d0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
              (&local_b0,__return_storage_ptr__,&local_d0);
    local_90 = (double)(local_c8 / fVar7);
    local_30 = local_90;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_b0,&local_30);
    local_38 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_38);
    local_40 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_40);
    local_28 = -local_c8;
    uStack_24 = uStack_c4 ^ 0x80000000;
    uStack_20 = uStack_c0 ^ 0x80000000;
    uStack_1c = uStack_bc ^ 0x80000000;
    local_48 = (Scalar)(local_28 / fVar8);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_48);
    local_50 = (Scalar)(fVar6 / fVar8);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_50);
    local_58 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_58);
    local_60 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_60);
    local_68 = (Scalar)((((float)dVar1 * local_c8 - (float)dVar2 * fVar6) * local_c8) /
                       (fVar8 * fVar7));
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_68);
    local_70 = (Scalar)((((float)dVar2 * fVar6 + local_28 * (float)dVar1) * fVar6) / (fVar8 * fVar7)
                       );
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_70);
    local_78 = local_88;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_78);
    local_80 = local_90;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_80);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "CalculateJacobian () - Error - Division by Zero - Returning zero matrix"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    local_d0 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
              (&local_b0,__return_storage_ptr__,&local_d0);
    local_30 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_b0,&local_30);
    local_38 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_38);
    local_40 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_40);
    local_48 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_48);
    local_50 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_50);
    local_58 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_58);
    local_60 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_60);
    local_68 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_68);
    local_70 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_70);
    local_78 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_78);
    local_80 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_80);
  }
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

MatrixXd Tools::CalculateJacobian(const VectorXd& x_state) {
  /**
  TODO:
    * Calculate a Jacobian here.
  */

  MatrixXd Hj(3,4);

  //recover state parameters
  float px = x_state(0);
  float py = x_state(1);
  float vx = x_state(2);
  float vy = x_state(3);

  //pre-compute a set of terms to avoid repeated calculation
  float c1 = px*px+py*py;
  float c2 = sqrt(c1);
  float c3 = (c1*c2);

  //check division by zero
  if(fabs(c1) < 0.0001){
    cout << "CalculateJacobian () - Error - Division by Zero - Returning zero matrix" << endl;
    Hj << 0, 0, 0, 0,
          0, 0, 0, 0,
          0, 0, 0, 0;
    return Hj;
  }

  //compute the Jacobian matrix
  Hj << (px/c2), (py/c2), 0, 0,
       -(py/c1), (px/c1), 0, 0,
       py*(vx*py - vy*px)/c3, px*(px*vy - py*vx)/c3, px/c2, py/c2;

  return Hj;
}